

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.h
# Opt level: O2

void __thiscall Assimp::IFC::CurveError::~CurveError(CurveError *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CurveError(const std::string& s)
    : mStr(s) {
        // empty
    }